

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall
StaticContentsSock::Accept(StaticContentsSock *this,sockaddr *addr,socklen_t *addr_len)

{
  long lVar1;
  uint16_t uVar2;
  uint *in_RCX;
  undefined2 *in_RDX;
  _Head_base<0UL,_Sock_*,_false> in_RDI;
  long in_FS_OFFSET;
  sockaddr_in *addr_in;
  socklen_t write_len;
  _Head_base<0UL,_Sock_*,_false> this_00;
  _Head_base<0UL,_Sock_*,_false> __args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl = in_RDI._M_head_impl;
  __args._M_head_impl = in_RDI._M_head_impl;
  if ((in_RDX != (undefined2 *)0x0) && (memset(in_RDX,0,(ulong)*in_RCX), 0xf < *in_RCX)) {
    *in_RCX = 0x10;
    *in_RDX = 2;
    memset(in_RDX + 2,5,4);
    uVar2 = htons(0x1a85);
    in_RDX[1] = uVar2;
  }
  std::make_unique<StaticContentsSock,char_const(&)[1]>((char (*) [1])__args._M_head_impl);
  std::unique_ptr<Sock,std::default_delete<Sock>>::
  unique_ptr<StaticContentsSock,std::default_delete<StaticContentsSock>,void>
            ((unique_ptr<Sock,_std::default_delete<Sock>_> *)this_00._M_head_impl,
             (unique_ptr<StaticContentsSock,_std::default_delete<StaticContentsSock>_> *)
             in_RDI._M_head_impl);
  std::unique_ptr<StaticContentsSock,_std::default_delete<StaticContentsSock>_>::~unique_ptr
            ((unique_ptr<StaticContentsSock,_std::default_delete<StaticContentsSock>_> *)
             this_00._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
         (tuple<Sock_*,_std::default_delete<Sock>_>)this_00._M_head_impl;
}

Assistant:

std::unique_ptr<Sock> Accept(sockaddr* addr, socklen_t* addr_len) const override
    {
        if (addr != nullptr) {
            // Pretend all connections come from 5.5.5.5:6789
            memset(addr, 0x00, *addr_len);
            const socklen_t write_len = static_cast<socklen_t>(sizeof(sockaddr_in));
            if (*addr_len >= write_len) {
                *addr_len = write_len;
                sockaddr_in* addr_in = reinterpret_cast<sockaddr_in*>(addr);
                addr_in->sin_family = AF_INET;
                memset(&addr_in->sin_addr, 0x05, sizeof(addr_in->sin_addr));
                addr_in->sin_port = htons(6789);
            }
        }
        return std::make_unique<StaticContentsSock>("");
    }